

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationErrorHandler.cpp
# Opt level: O3

bool __thiscall ValidationErrorHandler::handleError(ValidationErrorHandler *this,IError *error)

{
  ErrorType EVar1;
  ParserError *this_00;
  int iVar2;
  ostream *poVar3;
  char *__s2;
  char *__s1;
  String local_40;
  
  iVar2 = (*error->_vptr_IError[2])(error);
  if (iVar2 != 0) {
    iVar2 = (*error->_vptr_IError[2])(error);
    if (iVar2 != 1) {
      return false;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sax FWL Error: ",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)error[2]._vptr_IError,
                        (long)error[3]._vptr_IError);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    this->mHasHandledSaxFWLError = true;
    return false;
  }
  this_00 = (ParserError *)error[1]._vptr_IError;
  EVar1 = this_00->mErrorType;
  if (EVar1 == ERROR_COULD_NOT_OPEN_FILE) {
    this->mFileNotFound = true;
  }
  else {
    if (EVar1 == ERROR_VALIDATION_SEQUENCE_PREVIOUS_SIBLING_NOT_PRESENT) {
      iVar2 = strcmp(this_00->mElementName,"extra");
      if (iVar2 != 0) goto LAB_00647c54;
      __s1 = (this_00->mAdditionalText)._M_dataplus._M_p;
      __s2 = "sibling: fx_profile_abstract";
    }
    else {
      if (EVar1 != ERROR_VALIDATION_MIN_OCCURS_UNMATCHED) goto LAB_00647c54;
      __s1 = this_00->mElementName;
      __s2 = "effect";
    }
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 == 0) {
      return false;
    }
  }
LAB_00647c54:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Schema validation error: ",0x19);
  GeneratedSaxParser::ParserError::getErrorMessage_abi_cxx11_(&local_40,this_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this->mHasHandledSaxParserError = true;
  return false;
}

Assistant:

bool ValidationErrorHandler::handleError( const COLLADASaxFWL::IError* error )
{
	if ( error->getErrorClass() == COLLADASaxFWL::IError::ERROR_SAXPARSER )
	{
		COLLADASaxFWL::SaxParserError* saxParserError = (COLLADASaxFWL::SaxParserError*) error;
		const GeneratedSaxParser::ParserError& parserError = saxParserError->getError();

		// Workaround to avoid wrong error
		if ( parserError.getErrorType() == GeneratedSaxParser::ParserError::ERROR_VALIDATION_MIN_OCCURS_UNMATCHED)
		{
			if ( strcmp(parserError.getElement(), "effect") == 0 )
			{
				return false;
			}
		}
		if ( parserError.getErrorType() == GeneratedSaxParser::ParserError::ERROR_VALIDATION_SEQUENCE_PREVIOUS_SIBLING_NOT_PRESENT)
		{
			if ( (strcmp(parserError.getElement(), "extra") == 0) 
				&& (strcmp(parserError.getAdditionalText().c_str(), "sibling: fx_profile_abstract") == 0)) 
			{

				return false;
			}
		}

		if ( parserError.getErrorType() == GeneratedSaxParser::ParserError::ERROR_COULD_NOT_OPEN_FILE)
		{
			mFileNotFound = true;
		}

		std::cout << "Schema validation error: " << parserError.getErrorMessage() << std::endl;
		mHasHandledSaxParserError = true;
	}
	else if ( error->getErrorClass() == COLLADASaxFWL::IError::ERROR_SAXFWL )
	{
		COLLADASaxFWL::SaxFWLError* saxFWLError = (COLLADASaxFWL::SaxFWLError*) error;
		std::cout << "Sax FWL Error: " << saxFWLError->getErrorMessage() << std::endl;
		mHasHandledSaxFWLError = true;
	}
	return false;
}